

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O2

void it_retrigger_note(DUMB_IT_SIGRENDERER *sigrenderer,IT_CHANNEL *channel)

{
  ushort uVar1;
  uint uVar2;
  DUMB_IT_SIGDATA *pDVar3;
  IT_PLAYING *pIVar4;
  bool bVar5;
  uchar uVar6;
  int iVar7;
  IT_PLAYING *pIVar8;
  long lVar9;
  IT_INSTRUMENT *pIVar10;
  uchar uVar11;
  IT_INSTRUMENT *instrument;
  IT_PLAYING *playing;
  long lVar12;
  byte bVar13;
  int local_44;
  int local_40;
  int local_3c;
  
  pDVar3 = sigrenderer->sigdata;
  pIVar8 = channel->playing;
  uVar11 = '\x03';
  if (pIVar8 == (IT_PLAYING *)0x0) {
    bVar5 = false;
    local_3c = 0;
    local_40 = 0;
    local_44 = 0;
    uVar6 = uVar11;
    goto LAB_00585453;
  }
  bVar13 = channel->note;
  bVar5 = false;
  if (bVar13 == 0xfe) {
LAB_005853e7:
    uVar6 = '\0';
  }
  else if (bVar13 == 0xff) {
    uVar6 = '\x02';
  }
  else {
    uVar6 = '\x03';
    if (bVar13 < 0x79) {
      if ((pIVar8->instrument == (IT_INSTRUMENT *)0x0) || ((pIVar8->flags & 8) != 0))
      goto LAB_005853e7;
      uVar6 = channel->new_note_action;
      if (uVar6 == 0xff) {
        uVar6 = pIVar8->instrument->new_note_action;
      }
    }
  }
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  if ((pIVar8->flags & 2U) == 0) {
    if (uVar6 == '\0') {
      local_44 = 0;
    }
    else {
      local_44 = (pIVar8->volume_envelope).tick;
    }
    local_40 = (pIVar8->pan_envelope).tick;
    local_3c = (pIVar8->pitch_envelope).tick;
    bVar5 = true;
  }
  if (uVar6 == '\x03') {
    pIVar8->flags = pIVar8->flags | 5;
    uVar6 = uVar11;
  }
  else if (uVar6 == '\x02') {
    it_note_off(pIVar8);
    uVar6 = uVar11;
  }
  else if (uVar6 == '\0') {
    pIVar8->declick_stage = '\x03';
    uVar6 = '\0';
  }
LAB_00585453:
  channel->new_note_action = 0xff;
  if ((channel->sample != 0) && (channel->note < 0x79)) {
    channel->destnote = 0xff;
    pIVar8 = channel->playing;
    if (pIVar8 != (IT_PLAYING *)0x0) {
      lVar12 = 0x504;
      do {
        lVar9 = lVar12;
        if (lVar9 == 0x5c4) goto LAB_005854ab;
        lVar12 = lVar9 + 1;
      } while (*(long *)(sigrenderer->channel[0].arpeggio_offsets + lVar9 * 8 + -0x50) != 0);
      *(IT_PLAYING **)(sigrenderer->channel[0].arpeggio_offsets + lVar9 * 8 + -0x50) = pIVar8;
      channel->playing = (IT_PLAYING *)0x0;
      pIVar8 = (IT_PLAYING *)0x0;
LAB_005854ab:
      if ((sigrenderer->sigdata->flags & 4) != 0) {
        for (lVar12 = 0; lVar12 != 0xc0; lVar12 = lVar12 + 1) {
          pIVar8 = sigrenderer->playing[lVar12];
          if ((pIVar8 != (IT_PLAYING *)0x0) && (pIVar8->channel == channel)) {
            switch(pIVar8->instrument->dup_check_type) {
            case '\0':
              break;
            case '\x01':
              if (channel->truenote == pIVar8->note) goto switchD_00585505_caseD_2;
              break;
            case '\x02':
switchD_00585505_caseD_2:
              if (channel->sample == pIVar8->sampnum) goto switchD_00585505_caseD_3;
              break;
            case '\x03':
switchD_00585505_caseD_3:
              if (channel->instrument == pIVar8->instnum) goto switchD_00585505_default;
              break;
            default:
switchD_00585505_default:
              uVar11 = pIVar8->instrument->dup_check_action;
              if (uVar11 == '\x02') {
                *(byte *)&pIVar8->flags = (byte)pIVar8->flags | 5;
              }
              else if (uVar11 == '\x01') {
                if ((pIVar8->flags & 2) == 0) {
                  it_note_off(pIVar8);
                }
              }
              else if ((uVar11 == '\0') &&
                      (pIVar8->declick_stage = '\x03', channel->playing == pIVar8)) {
                channel->playing = (IT_PLAYING *)0x0;
              }
            }
          }
        }
        pIVar8 = channel->playing;
      }
      if (pIVar8 != (IT_PLAYING *)0x0) {
        pIVar8->next = sigrenderer->free_playing;
        sigrenderer->free_playing = pIVar8;
      }
    }
    pIVar8 = new_playing(sigrenderer);
    channel->playing = pIVar8;
    if (pIVar8 != (IT_PLAYING *)0x0) {
      uVar2 = pDVar3->flags;
      if (bVar5) {
LAB_005855a3:
        bVar5 = false;
      }
      else {
        bVar5 = true;
        if ((uVar2 & 4) != 0) {
          for (lVar12 = 0; lVar12 != 0xc0; lVar12 = lVar12 + 1) {
            pIVar4 = sigrenderer->playing[lVar12];
            if (((pIVar4 != (IT_PLAYING *)0x0) && (pIVar4->channel == channel)) &&
               ((pIVar4->flags & 2) == 0)) {
              if (uVar6 != '\0') {
                local_44 = (pIVar4->volume_envelope).tick;
              }
              local_40 = (pIVar4->pan_envelope).tick;
              local_3c = (pIVar4->pitch_envelope).tick;
              goto LAB_005855a3;
            }
          }
        }
      }
      pIVar8->flags = 0;
      pIVar8->resampling_quality = sigrenderer->resampling_quality;
      pIVar8->channel = channel;
      uVar1 = channel->sample;
      pIVar8->sample = pDVar3->sample + ((ulong)uVar1 - 1);
      if ((uVar2 & 4) == 0) {
        bVar13 = channel->instrument;
        pIVar10 = (IT_INSTRUMENT *)0x0;
      }
      else {
        bVar13 = channel->instrument;
        pIVar10 = pDVar3->instrument + ((ulong)bVar13 - 1);
      }
      pIVar8->instrument = pIVar10;
      pIVar8->env_instrument = pIVar10;
      pIVar8->sampnum = uVar1;
      pIVar8->instnum = bVar13;
      pIVar8->declick_stage = '\0';
      pIVar8->channel_volume = channel->channelvolume;
      uVar11 = channel->truenote;
      pIVar8->volume_offset = '\0';
      pIVar8->panning_offset = '\0';
      pIVar8->note = uVar11;
      pIVar8->enabled_envelopes = '\0';
      if ((uVar2 & 4) != 0) {
        bVar13 = ((pIVar10->volume_envelope).flags & 1) != 0;
        if ((bool)bVar13) {
          pIVar8->enabled_envelopes = '\x01';
        }
        if (((pIVar10->pan_envelope).flags & 1) != 0) {
          bVar13 = bVar13 | 2;
          pIVar8->enabled_envelopes = bVar13;
        }
        if (((pIVar10->pitch_envelope).flags & 1) != 0) {
          pIVar8->enabled_envelopes = bVar13 | 4;
        }
        if (pIVar10->random_volume != '\0') {
          iVar7 = rand();
          pIVar8->volume_offset =
               (char)(iVar7 % (int)((uint)pIVar10->random_volume * 2 + 1)) - pIVar10->random_volume;
        }
        if (pIVar10->random_pan != '\0') {
          iVar7 = rand();
          pIVar8->panning_offset =
               (char)(iVar7 % (int)((uint)pIVar10->random_pan * 2 + 1)) - pIVar10->random_pan;
        }
      }
      pIVar8 = channel->playing;
      pIVar8->filter_cutoff = '\x7f';
      pIVar8->filter_resonance = '\0';
      pIVar8->true_filter_cutoff = 0x7f00;
      pIVar8->true_filter_resonance = '\0';
      pIVar8->vibrato_speed = '\0';
      pIVar8->vibrato_depth = '\0';
      pIVar8->vibrato_n = '\0';
      pIVar8->vibrato_time = '\0';
      pIVar8->vibrato_waveform = channel->vibrato_waveform;
      pIVar8->tremolo_speed = '\0';
      pIVar8->tremolo_depth = '\0';
      pIVar8->tremolo_time = '\0';
      pIVar8->tremolo_waveform = channel->tremolo_waveform;
      pIVar8->panbrello_speed = '\0';
      pIVar8->panbrello_depth = '\0';
      pIVar8->panbrello_time = '\0';
      pIVar8->panbrello_waveform = channel->panbrello_waveform;
      pIVar8->panbrello_random = '\0';
      pIVar8->sample_vibrato_time = '\0';
      pIVar8->sample_vibrato_waveform = pIVar8->sample->vibrato_waveform;
      pIVar8->sample_vibrato_depth = 0;
      pIVar8->slide = 0;
      pIVar8->finetune = (int)pIVar8->sample->finetune;
      if ((pDVar3->flags & 4) != 0) {
        if (bVar5) {
          (pIVar8->volume_envelope).tick = 0;
          (pIVar8->pan_envelope).tick = 0;
          pIVar10 = pIVar8->env_instrument;
          local_3c = 0;
        }
        else {
          pIVar10 = pIVar8->env_instrument;
          iVar7 = 0;
          if (((pIVar10->volume_envelope).flags & 8) == 0) {
            local_44 = iVar7;
          }
          (pIVar8->volume_envelope).tick = local_44;
          if (((pIVar10->pan_envelope).flags & 8) == 0) {
            local_40 = iVar7;
          }
          (pIVar8->pan_envelope).tick = local_40;
          if (((pIVar10->pitch_envelope).flags & 8) == 0) {
            local_3c = iVar7;
          }
        }
        (pIVar8->pitch_envelope).tick = local_3c;
        recalculate_it_envelope_node(&pIVar8->volume_envelope,&pIVar10->volume_envelope);
        recalculate_it_envelope_node(&pIVar8->pan_envelope,&pIVar8->env_instrument->pitch_envelope);
        recalculate_it_envelope_node
                  (&pIVar8->pitch_envelope,&pIVar8->env_instrument->pitch_envelope);
        pIVar8 = channel->playing;
      }
      pIVar8->fadeoutcount = 0x400;
      pIVar8->filter_state[0].currsample = 0;
      pIVar8->filter_state[0].prevsample = 0;
      pIVar8->filter_state[1].currsample = 0;
      pIVar8->filter_state[1].prevsample = 0;
      it_playing_reset_resamplers(pIVar8,0);
      return;
    }
  }
  return;
}

Assistant:

static void it_retrigger_note(DUMB_IT_SIGRENDERER *sigrenderer, IT_CHANNEL *channel)
{
	int vol_env_tick = 0;
	int pan_env_tick = 0;
	int pitch_env_tick = 0;

	DUMB_IT_SIGDATA *sigdata = sigrenderer->sigdata;
	unsigned char nna = ~0;
	int i, envelopes_copied = 0;

	if (channel->playing) {
		if (channel->note == IT_NOTE_CUT)
			nna = NNA_NOTE_CUT;
		else if (channel->note == IT_NOTE_OFF)
			nna = NNA_NOTE_OFF;
		else if (channel->note > 120)
			nna = NNA_NOTE_FADE;
		else if (!channel->playing->instrument || (channel->playing->flags & IT_PLAYING_DEAD))
			nna = NNA_NOTE_CUT;
		else if (channel->new_note_action != 0xFF)
		{
			nna = channel->new_note_action;
		}
		else
			nna = channel->playing->instrument->new_note_action;

		if (!(channel->playing->flags & IT_PLAYING_SUSTAINOFF))
		{
			if (nna != NNA_NOTE_CUT)
				vol_env_tick = channel->playing->volume_envelope.tick;
			pan_env_tick = channel->playing->pan_envelope.tick;
			pitch_env_tick = channel->playing->pitch_envelope.tick;
			envelopes_copied = 1;
		}

		switch (nna) {
			case NNA_NOTE_CUT:
				channel->playing->declick_stage = 3;
				break;
			case NNA_NOTE_OFF:
				it_note_off(channel->playing);
				break;
			case NNA_NOTE_FADE:
				channel->playing->flags |= IT_PLAYING_BACKGROUND | IT_PLAYING_FADING;
				break;
		}
	}

	channel->new_note_action = 0xFF;

	if (channel->sample == 0 || channel->note > 120)
		return;

	channel->destnote = IT_NOTE_OFF;

	if (channel->playing) {
		for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++) {
			if (!sigrenderer->playing[i]) {
				sigrenderer->playing[i] = channel->playing;
				channel->playing = NULL;
				break;
			}
		}

		if (sigrenderer->sigdata->flags & IT_USE_INSTRUMENTS)
		{
			for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++) {
				IT_PLAYING * playing = sigrenderer->playing[i];
				if (playing && playing->channel == channel && playing->instrument->dup_check_type) {
					int match = 1;
					switch (playing->instrument->dup_check_type)
					{
					case DCT_NOTE:
						match = (channel->truenote == playing->note);
					case DCT_SAMPLE:
						match = match && (channel->sample == playing->sampnum);
					case DCT_INSTRUMENT:
						match = match && (channel->instrument == playing->instnum);
						break;
					}

					if (match)
					{
						switch (playing->instrument->dup_check_action)
						{
						case DCA_NOTE_CUT:
							playing->declick_stage = 3;
							if (channel->playing == playing) channel->playing = NULL;
							break;
						case DCA_NOTE_OFF:
							if (!(playing->flags & IT_PLAYING_SUSTAINOFF))
								it_note_off(playing);
							break;
						case DCA_NOTE_FADE:
							playing->flags |= IT_PLAYING_BACKGROUND | IT_PLAYING_FADING;
							break;
						}
					}
				}
			}
		}

/** WARNING - come up with some more heuristics for replacing old notes */
#if 0
		if (channel->playing) {
			for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++) {
				if (sigrenderer->playing[i]->flags & IT_PLAYING_BACKGROUND) {
					write_seqtime();
					sequence_c(SEQUENCE_STOP_SIGNAL);
					sequence_c(i);
					channel->VChannel = &module->VChannel[i];
					break;
				}
			}
		}
#endif
	}

	if (channel->playing)
		free_playing(sigrenderer, channel->playing);

	channel->playing = new_playing(sigrenderer);

	if (!channel->playing)
		return;

	if (!envelopes_copied && sigdata->flags & IT_USE_INSTRUMENTS) {
		for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++) {
			IT_PLAYING * playing = sigrenderer->playing[i];
			if (!playing || playing->channel != channel) continue;
			if (playing->flags & IT_PLAYING_SUSTAINOFF) continue;
			if (nna != NNA_NOTE_CUT)
				vol_env_tick = playing->volume_envelope.tick;
			pan_env_tick = playing->pan_envelope.tick;
			pitch_env_tick = playing->pitch_envelope.tick;
			envelopes_copied = 1;
			break;
		}
	}				

	channel->playing->flags = 0;
	channel->playing->resampling_quality = sigrenderer->resampling_quality;
	channel->playing->channel = channel;
	channel->playing->sample = &sigdata->sample[channel->sample-1];
	if (sigdata->flags & IT_USE_INSTRUMENTS)
		channel->playing->instrument = &sigdata->instrument[channel->instrument-1];
	else
		channel->playing->instrument = NULL;
	channel->playing->env_instrument = channel->playing->instrument;
	channel->playing->sampnum = channel->sample;
	channel->playing->instnum = channel->instrument;
	channel->playing->declick_stage = 0;
	channel->playing->channel_volume = channel->channelvolume;
	channel->playing->note = channel->truenote;
	channel->playing->enabled_envelopes = 0;
	channel->playing->volume_offset = 0;
	channel->playing->panning_offset = 0;
	//channel->playing->output = channel->output;
	if (sigdata->flags & IT_USE_INSTRUMENTS) {
		IT_PLAYING * playing = channel->playing;
		IT_INSTRUMENT * instrument = playing->instrument;
		if (instrument->volume_envelope.flags & IT_ENVELOPE_ON) playing->enabled_envelopes |= IT_ENV_VOLUME;
		if (instrument->pan_envelope.flags & IT_ENVELOPE_ON) playing->enabled_envelopes |= IT_ENV_PANNING;
		if (instrument->pitch_envelope.flags & IT_ENVELOPE_ON) playing->enabled_envelopes |= IT_ENV_PITCH;
		if (instrument->random_volume) playing->volume_offset = (rand() % (instrument->random_volume * 2 + 1)) - instrument->random_volume;
		if (instrument->random_pan) playing->panning_offset = (rand() % (instrument->random_pan * 2 + 1)) - instrument->random_pan;
		//if (instrument->output) playing->output = instrument->output;
	}
	channel->playing->filter_cutoff = 127;
	channel->playing->filter_resonance = 0;
	channel->playing->true_filter_cutoff = 127 << 8;
	channel->playing->true_filter_resonance = 0;
	channel->playing->vibrato_speed = 0;
	channel->playing->vibrato_depth = 0;
	channel->playing->vibrato_n = 0;
	channel->playing->vibrato_time = 0;
	channel->playing->vibrato_waveform = channel->vibrato_waveform;
	channel->playing->tremolo_speed = 0;
	channel->playing->tremolo_depth = 0;
	channel->playing->tremolo_time = 0;
	channel->playing->tremolo_waveform = channel->tremolo_waveform;
	channel->playing->panbrello_speed = 0;
	channel->playing->panbrello_depth = 0;
	channel->playing->panbrello_time = 0;
	channel->playing->panbrello_waveform = channel->panbrello_waveform;
	channel->playing->panbrello_random = 0;
	channel->playing->sample_vibrato_time = 0;
	channel->playing->sample_vibrato_waveform = channel->playing->sample->vibrato_waveform;
	channel->playing->sample_vibrato_depth = 0;
	channel->playing->slide = 0;
	channel->playing->finetune = channel->playing->sample->finetune;

	if (sigdata->flags & IT_USE_INSTRUMENTS)
	{
		if (envelopes_copied && channel->playing->env_instrument->volume_envelope.flags & IT_ENVELOPE_CARRY) {
			channel->playing->volume_envelope.tick = vol_env_tick;
		} else {
			channel->playing->volume_envelope.tick = 0;
		}
		if (envelopes_copied && channel->playing->env_instrument->pan_envelope.flags & IT_ENVELOPE_CARRY) {
			channel->playing->pan_envelope.tick = pan_env_tick;
		} else {
			channel->playing->pan_envelope.tick = 0;
		}
		if (envelopes_copied && channel->playing->env_instrument->pitch_envelope.flags & IT_ENVELOPE_CARRY) {
			channel->playing->pitch_envelope.tick = pitch_env_tick;
		} else {
			channel->playing->pitch_envelope.tick = 0;
		}
		recalculate_it_envelope_nodes(channel->playing);
	}
	channel->playing->fadeoutcount = 1024;
	it_reset_filter_state(&channel->playing->filter_state[0]);
	it_reset_filter_state(&channel->playing->filter_state[1]);
	it_playing_reset_resamplers(channel->playing, 0);

	/** WARNING - is everything initialised? */
}